

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O0

bool __thiscall draco::Metadata::GetEntryInt(Metadata *this,string *name,int32_t *value)

{
  bool bVar1;
  int *in_RDI;
  
  bVar1 = GetEntry<int>((Metadata *)name,(string *)value,in_RDI);
  return bVar1;
}

Assistant:

bool Metadata::GetEntryInt(const std::string &name, int32_t *value) const {
  return GetEntry(name, value);
}